

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_intra_pred_luma_ver_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  UWORD8 UVar5;
  short sVar6;
  int iVar7;
  int local_6cc;
  int local_678;
  UWORD8 *local_668;
  int temp1_1;
  WORD32 itr_count;
  __m128i temp2;
  __m128i temp1;
  __m128i src_temp2;
  __m128i src_temp0;
  WORD32 two_nt;
  WORD16 s2_predpixel;
  WORD32 row;
  WORD32 mode_local;
  WORD32 nt_local;
  WORD32 dst_strd_local;
  UWORD8 *pu1_dst_local;
  WORD32 src_strd_local;
  
  iVar7 = nt * 2;
  if (nt == 0x20) {
    uVar1 = *(undefined8 *)(pu1_ref + (long)iVar7 + 1);
    uVar2 = *(undefined8 *)(pu1_ref + (long)iVar7 + 9);
    uVar3 = *(undefined8 *)(pu1_ref + (long)iVar7 + 0x11);
    uVar4 = *(undefined8 *)(pu1_ref + (long)iVar7 + 0x19);
    local_668 = pu1_dst;
    for (local_6cc = 0; local_6cc < 2; local_6cc = local_6cc + 1) {
      *(undefined8 *)local_668 = uVar1;
      *(undefined8 *)(local_668 + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd) = uVar1;
      *(undefined8 *)(local_668 + dst_strd + 8) = uVar2;
      *(undefined8 *)(local_668 + (dst_strd << 1)) = uVar1;
      *(undefined8 *)(local_668 + (dst_strd << 1) + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 3) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 3 + 8) = uVar2;
      *(undefined8 *)(local_668 + (dst_strd << 2)) = uVar1;
      *(undefined8 *)(local_668 + (dst_strd << 2) + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 5) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 5 + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 6) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 6 + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 7) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 7 + 8) = uVar2;
      *(undefined8 *)(local_668 + 0x10) = uVar3;
      *(undefined8 *)(local_668 + 0x18) = uVar4;
      *(undefined8 *)(local_668 + (long)dst_strd + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)dst_strd + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd << 1) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd << 1) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 3) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 3) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd << 2) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd << 2) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 5) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 5) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 6) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 6) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 7) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 7) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (dst_strd << 3)) = uVar1;
      *(undefined8 *)(local_668 + (dst_strd << 3) + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 9) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 9 + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 10) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 10 + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 0xb) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 0xb + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 0xc) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 0xc + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 0xd) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 0xd + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 0xe) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 0xe + 8) = uVar2;
      *(undefined8 *)(local_668 + dst_strd * 0xf) = uVar1;
      *(undefined8 *)(local_668 + dst_strd * 0xf + 8) = uVar2;
      *(undefined8 *)(local_668 + (long)(dst_strd << 3) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd << 3) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 9) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 9) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 10) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 10) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 0xb) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 0xb) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 0xc) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 0xc) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 0xd) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 0xd) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 0xe) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 0xe) + 0x10 + 8) = uVar4;
      *(undefined8 *)(local_668 + (long)(dst_strd * 0xf) + 0x10) = uVar3;
      *(undefined8 *)(local_668 + (long)(dst_strd * 0xf) + 0x10 + 8) = uVar4;
      local_668 = local_668 + (dst_strd << 4);
    }
  }
  else {
    if (nt == 4) {
      two_nt = (WORD32)*(undefined8 *)(pu1_ref + (long)iVar7 + 1);
      *(WORD32 *)pu1_dst = two_nt;
      *(WORD32 *)(pu1_dst + dst_strd) = two_nt;
      *(WORD32 *)(pu1_dst + (dst_strd << 1)) = two_nt;
      *(WORD32 *)(pu1_dst + dst_strd * 3) = two_nt;
    }
    else if (nt == 8) {
      uVar1 = *(undefined8 *)(pu1_ref + (long)iVar7 + 1);
      *(undefined8 *)pu1_dst = uVar1;
      *(undefined8 *)(pu1_dst + dst_strd) = uVar1;
      *(undefined8 *)(pu1_dst + dst_strd * 2) = uVar1;
      *(undefined8 *)(pu1_dst + dst_strd * 3) = uVar1;
      *(undefined8 *)(pu1_dst + (dst_strd << 2)) = uVar1;
      *(undefined8 *)(pu1_dst + dst_strd * 5) = uVar1;
      *(undefined8 *)(pu1_dst + dst_strd * 6) = uVar1;
      *(undefined8 *)(pu1_dst + dst_strd * 7) = uVar1;
    }
    else if (nt == 0x10) {
      for (local_678 = 0; local_678 < 0x10; local_678 = local_678 + 8) {
        uVar1 = *(undefined8 *)(pu1_ref + (long)iVar7 + 1);
        uVar2 = *(undefined8 *)(pu1_ref + (long)iVar7 + 9);
        *(undefined8 *)(pu1_dst + local_678 * dst_strd) = uVar1;
        *(undefined8 *)(pu1_dst + local_678 * dst_strd + 8) = uVar2;
        *(undefined8 *)(pu1_dst + (local_678 + 1) * dst_strd) = uVar1;
        *(undefined8 *)(pu1_dst + (local_678 + 1) * dst_strd + 8) = uVar2;
        *(undefined8 *)(pu1_dst + (local_678 + 2) * dst_strd) = uVar1;
        *(undefined8 *)(pu1_dst + (local_678 + 2) * dst_strd + 8) = uVar2;
        *(undefined8 *)(pu1_dst + (local_678 + 3) * dst_strd) = uVar1;
        *(undefined8 *)(pu1_dst + (local_678 + 3) * dst_strd + 8) = uVar2;
        *(undefined8 *)(pu1_dst + (local_678 + 4) * dst_strd) = uVar1;
        *(undefined8 *)(pu1_dst + (local_678 + 4) * dst_strd + 8) = uVar2;
        *(undefined8 *)(pu1_dst + (local_678 + 5) * dst_strd) = uVar1;
        *(undefined8 *)(pu1_dst + (local_678 + 5) * dst_strd + 8) = uVar2;
        *(undefined8 *)(pu1_dst + (local_678 + 6) * dst_strd) = uVar1;
        *(undefined8 *)(pu1_dst + (local_678 + 6) * dst_strd + 8) = uVar2;
        *(undefined8 *)(pu1_dst + (local_678 + 7) * dst_strd) = uVar1;
        *(undefined8 *)(pu1_dst + (local_678 + 7) * dst_strd + 8) = uVar2;
      }
    }
    for (local_678 = nt + -1; -1 < local_678; local_678 = local_678 + -1) {
      sVar6 = (ushort)pu1_ref[iVar7 + 1] +
              (short)((int)((uint)pu1_ref[(iVar7 + -1) - local_678] - (uint)pu1_ref[iVar7]) >> 1);
      if (sVar6 < 0x100) {
        if (sVar6 < 0) {
          sVar6 = 0;
        }
        UVar5 = (UWORD8)sVar6;
      }
      else {
        UVar5 = 0xff;
      }
      pu1_dst[local_678 * dst_strd] = UVar5;
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_ver_ssse3(UWORD8 *pu1_ref,
                                     WORD32 src_strd,
                                     UWORD8 *pu1_dst,
                                     WORD32 dst_strd,
                                     WORD32 nt,
                                     WORD32 mode)
{
    WORD32 row;
    WORD16 s2_predpixel;
    WORD32 two_nt = 2 * nt;
    __m128i src_temp0, src_temp2;
    UNUSED(src_strd);
    UNUSED(mode);


    if(nt == 32)
    {
        __m128i temp1, temp2;
        WORD32 itr_count;

        temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
        temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 16));

        for(itr_count = 0; itr_count < 2; itr_count++)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + ((0) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((0) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((1) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((2) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((3) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((4) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((5) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((6) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((7) * dst_strd)), temp2);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((8) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((9) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((10) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((11) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((12) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((13) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((14) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((15) * dst_strd)), temp2);

            pu1_dst += 16 * dst_strd;
        }
    }
    else
    {
        /* Replication to next columns*/

        if(nt == 4)
        {
            int temp1;

            src_temp2 =   _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            temp1 = _mm_cvtsi128_si32(src_temp2);

            /* loding 4-bit 8 pixels values */
            *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp1;

        }
        else if(nt == 8)
        {

            src_temp0 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            _mm_storel_epi64((__m128i *)(pu1_dst + ((0) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp0);


        }
        else if(nt == 16)
        {
            for(row = 0; row < nt; row += 8)
            {

                src_temp0 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp0);

            }

        }

        /*Filtering done for the 1st column */
        for(row = nt - 1; row >= 0; row--)
        {
            s2_predpixel = pu1_ref[two_nt + 1]
                            + ((pu1_ref[two_nt - 1 - row] - pu1_ref[two_nt]) >> 1);
            pu1_dst[row * dst_strd] = CLIP_U8(s2_predpixel);
        }


    }
}